

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O2

void G_DoNewGame(void)

{
  G_NewInit();
  playeringame[consoleplayer] = true;
  if (d_skill != -1) {
    FIntCVar::operator=(&gameskill,d_skill);
  }
  G_InitNew(d_mapname.Chars,false);
  gameaction = ga_nothing;
  return;
}

Assistant:

void G_DoNewGame (void)
{
	G_NewInit ();
	playeringame[consoleplayer] = 1;
	if (d_skill != -1)
	{
		gameskill = d_skill;
	}
	G_InitNew (d_mapname, false);
	gameaction = ga_nothing;
}